

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int local_a4;
  int local_a0;
  int status;
  int i;
  int exec_errorno;
  int err;
  pid_t pid;
  ssize_t r;
  int (*paiStack_80) [2];
  int stdio_count;
  int (*pipes) [2];
  int pipes_storage [8] [2];
  int local_30 [2];
  int signal_pipe [2];
  uv_process_options_t *options_local;
  uv_process_t *process_local;
  uv_loop_t *loop_local;
  
  local_30[0] = -1;
  local_30[1] = -1;
  signal_pipe = (int  [2])options;
  if ((options->cpumask != (char *)0x0) &&
     (uVar1 = options->cpumask_size, iVar2 = uv_cpumask_size(), uVar1 < (ulong)(long)iVar2)) {
    return -0x16;
  }
  if (*(long *)((long)signal_pipe + 8) == 0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x1e9,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if ((*(uint *)((long)signal_pipe + 0x28) & 0xffffff80) != 0) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_HIDE_CONSOLE | UV_PROCESS_WINDOWS_HIDE_GUI | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x1f0,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  process->handle_queue[0] = loop->handle_queue;
  process->handle_queue[1] = loop->handle_queue[1];
  *(void ***)process->handle_queue[1] = process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  process->queue[0] = process->queue;
  process->queue[1] = process->queue;
  r._4_4_ = *(int *)((long)signal_pipe + 0x2c);
  if (r._4_4_ < 3) {
    r._4_4_ = 3;
  }
  i = -0xc;
  paiStack_80 = (int (*) [2])&pipes;
  if (8 < r._4_4_) {
    paiStack_80 = (int (*) [2])uv__malloc((long)r._4_4_ << 3);
  }
  if (paiStack_80 != (int (*) [2])0x0) {
    for (local_a0 = 0; local_a0 < r._4_4_; local_a0 = local_a0 + 1) {
      paiStack_80[local_a0][0] = -1;
      paiStack_80[local_a0][1] = -1;
    }
    for (local_a0 = 0; local_a0 < *(int *)((long)signal_pipe + 0x2c); local_a0 = local_a0 + 1) {
      i = uv__process_init_stdio
                    ((uv_stdio_container_t *)
                     (*(long *)((long)signal_pipe + 0x30) + (long)local_a0 * 0x10),
                     paiStack_80[local_a0]);
      if (i != 0) goto LAB_0088ed47;
      i = 0;
    }
    i = uv__make_pipe(local_30,0);
    if (i == 0) {
      uv_signal_start(&loop->child_watcher,uv__chld,0x11);
      uv_rwlock_wrlock(&loop->cloexec_lock);
      exec_errorno = fork();
      if (exec_errorno == -1) {
        piVar3 = __errno_location();
        i = -*piVar3;
        uv_rwlock_wrunlock(&loop->cloexec_lock);
        uv__close(local_30[0]);
        uv__close(local_30[1]);
      }
      else {
        if (exec_errorno == 0) {
          uv__process_child_init
                    ((uv_process_options_t *)signal_pipe,r._4_4_,paiStack_80,local_30[1]);
          abort();
        }
        uv_rwlock_wrunlock(&loop->cloexec_lock);
        uv__close(local_30[1]);
        process->status = 0;
        status = 0;
        do {
          _err = read(local_30[0],&status,4);
          bVar4 = false;
          if (_err == -1) {
            piVar3 = __errno_location();
            bVar4 = *piVar3 == 4;
          }
        } while (bVar4);
        if (_err != 0) {
          if (_err == 4) {
            do {
              i = waitpid(exec_errorno,&local_a4,0);
              bVar4 = false;
              if (i == -1) {
                piVar3 = __errno_location();
                bVar4 = *piVar3 == 4;
              }
            } while (bVar4);
            if (i != exec_errorno) {
              __assert_fail("err == pid",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/process.c"
                            ,0x247,
                            "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)"
                           );
            }
          }
          else {
            if ((_err != -1) || (piVar3 = __errno_location(), *piVar3 != 0x20)) {
              abort();
            }
            do {
              i = waitpid(exec_errorno,&local_a4,0);
              bVar4 = false;
              if (i == -1) {
                piVar3 = __errno_location();
                bVar4 = *piVar3 == 4;
              }
            } while (bVar4);
            if (i != exec_errorno) {
              __assert_fail("err == pid",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/process.c"
                            ,0x24c,
                            "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)"
                           );
            }
          }
        }
        uv__close_nocheckstdio(local_30[0]);
        local_a0 = 0;
        while( true ) {
          if (*(int *)((long)signal_pipe + 0x2c) <= local_a0) {
            if (status == 0) {
              process->queue[0] = loop->process_handles;
              process->queue[1] = loop->process_handles[1];
              *(void ***)process->queue[1] = process->queue;
              loop->process_handles[1] = process->queue;
              if (((process->flags & 4) == 0) &&
                 (process->flags = process->flags | 4, (process->flags & 8) != 0)) {
                process->loop->active_handles = process->loop->active_handles + 1;
              }
            }
            process->pid = exec_errorno;
            process->exit_cb = *(uv_exit_cb *)signal_pipe;
            if (paiStack_80 != (int (*) [2])&pipes) {
              uv__free(paiStack_80);
            }
            return status;
          }
          i = uv__process_open_stream
                        ((uv_stdio_container_t *)
                         (*(long *)((long)signal_pipe + 0x30) + (long)local_a0 * 0x10),
                         paiStack_80[local_a0]);
          if (i != 0) break;
          local_a0 = local_a0 + 1;
          i = 0;
        }
        while (iVar2 = local_a0 + -1, local_a0 != 0) {
          local_a0 = iVar2;
          uv__process_close_stream
                    ((uv_stdio_container_t *)
                     (*(long *)((long)signal_pipe + 0x30) + (long)iVar2 * 0x10));
        }
      }
    }
  }
LAB_0088ed47:
  if (paiStack_80 != (int (*) [2])0x0) {
    for (local_a0 = 0; local_a0 < r._4_4_; local_a0 = local_a0 + 1) {
      if ((*(int *)((long)signal_pipe + 0x2c) <= local_a0) ||
         ((*(uint *)(*(long *)((long)signal_pipe + 0x30) + (long)local_a0 * 0x10) & 6) == 0)) {
        if (paiStack_80[local_a0][0] != -1) {
          uv__close_nocheckstdio(paiStack_80[local_a0][0]);
        }
        if (paiStack_80[local_a0][1] != -1) {
          uv__close_nocheckstdio(paiStack_80[local_a0][1]);
        }
      }
    }
    if (paiStack_80 != (int (*) [2])&pipes) {
      uv__free(paiStack_80);
    }
  }
  return i;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return UV_ENOSYS;
#else
  int signal_pipe[2] = { -1, -1 };
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;
  int status;

  if (options->cpumask != NULL) {
#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
    if (options->cpumask_size < (size_t)uv_cpumask_size()) {
      return UV_EINVAL;
    }
#else
    return UV_ENOTSUP;
#endif
#else
    return UV_ENOTSUP;
#endif
  }

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  /* Acquire write lock to prevent opening new fds in worker threads */
  uv_rwlock_wrlock(&loop->cloexec_lock);
  pid = fork();

  if (pid == -1) {
    err = UV__ERR(errno);
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  /* Release lock in parent process */
  uv_rwlock_wrunlock(&loop->cloexec_lock);
  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno)) {
    do
      err = waitpid(pid, &status, 0); /* okay, read errorno */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else if (r == -1 && errno == EPIPE) {
    do
      err = waitpid(pid, &status, 0); /* okay, got EPIPE */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else
    abort();

  uv__close_nocheckstdio(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}